

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O3

void DES_ncbc_encrypt_ex(uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *schedule,
                        uint8_t *ivec,int enc)

{
  byte *pbVar1;
  uint8_t uVar2;
  DES_key_schedule *pDVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  long lVar13;
  uint local_50;
  uint local_4c;
  DES_key_schedule *local_48;
  uint local_3c;
  uint8_t *local_38;
  
  uVar6 = *(uint *)ivec;
  uVar7 = *(uint *)(ivec + 4);
  if (enc == 0) {
    uVar10 = uVar6;
    local_3c = uVar7;
    pDVar3 = (DES_key_schedule *)schedule;
    puVar4 = ivec;
    if (7 < len) {
      do {
        local_38 = puVar4;
        local_48 = pDVar3;
        uVar6 = *(uint *)in;
        uVar7 = *(uint *)((long)in + 4);
        in = (uint8_t *)((long)in + 8);
        local_50 = uVar6;
        local_4c = uVar7;
        DES_encrypt1(&local_50,local_48,0);
        uVar10 = uVar10 ^ local_50;
        local_3c = local_3c ^ local_4c;
        *out = (uint8_t)uVar10;
        out[1] = (uint8_t)(uVar10 >> 8);
        out[2] = (uint8_t)(uVar10 >> 0x10);
        out[3] = (uint8_t)(uVar10 >> 0x18);
        out[4] = (uint8_t)local_3c;
        out[5] = (uint8_t)(local_3c >> 8);
        out[6] = (uint8_t)(local_3c >> 0x10);
        out[7] = (uint8_t)(local_3c >> 0x18);
        out = out + 8;
        len = len - 8;
        ivec = local_38;
        schedule = (DES_key_schedule *)local_48;
        uVar10 = uVar6;
        local_3c = uVar7;
        pDVar3 = local_48;
        puVar4 = local_38;
      } while (7 < len);
    }
    if (len != 0) {
      local_50 = *(uint *)in;
      local_4c = *(uint *)((long)in + 4);
      local_48 = (DES_key_schedule *)CONCAT44(local_48._4_4_,local_4c);
      local_3c = local_50;
      DES_encrypt1(&local_50,(DES_key_schedule *)schedule,0);
      (*(code *)(&DAT_001e067c + *(int *)(&DAT_001e067c + (len - 1) * 4)))();
      return;
    }
    *ivec = (uint8_t)uVar6;
    ivec[1] = (uint8_t)(uVar6 >> 8);
    ivec[2] = (uint8_t)(uVar6 >> 0x10);
    ivec[3] = (uint8_t)(uVar6 >> 0x18);
    ivec[4] = (uint8_t)uVar7;
    ivec[5] = (uint8_t)(uVar7 >> 8);
    ivec[6] = (uint8_t)(uVar7 >> 0x10);
    uVar12 = (uint8_t)(uVar7 >> 0x18);
    goto LAB_00164e4c;
  }
  local_50 = uVar6;
  local_4c = uVar7;
  if (7 < len) {
    do {
      local_50 = local_50 ^ *(uint *)in;
      local_4c = local_4c ^ *(uint *)((long)in + 4);
      in = (uint8_t *)((long)in + 8);
      DES_encrypt1(&local_50,(DES_key_schedule *)schedule,1);
      *(uint *)out = local_50;
      *(uint *)((long)out + 4) = local_4c;
      out = (uint8_t *)((long)out + 8);
      len = len - 8;
    } while (7 < len);
  }
  if (len == 0) {
    uVar5 = (uint8_t)(local_50 >> 8);
    uVar8 = (uint8_t)(local_50 >> 0x10);
    uVar9 = (uint8_t)(local_50 >> 0x18);
    uVar2 = (uint8_t)(local_4c >> 8);
    uVar11 = (uint8_t)(local_4c >> 0x10);
  }
  else {
    lVar13 = (long)in + len;
    uVar6 = 0;
    uVar7 = 0;
    switch(len) {
    case 1:
      uVar10 = 0;
      goto LAB_00164d55;
    case 2:
      uVar10 = 0;
      goto LAB_00164d48;
    case 3:
      uVar10 = 0;
      uVar6 = uVar7;
      break;
    case 7:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar6 = (uint)*pbVar1 << 0x10;
    case 6:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar6 = uVar6 | (uint)*pbVar1 << 8;
    case 5:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar7 = uVar6 | *pbVar1;
    case 4:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar6 = (uint)*pbVar1 << 0x18;
      uVar10 = uVar7;
    }
    pbVar1 = (byte *)(lVar13 + -1);
    lVar13 = lVar13 + -1;
    uVar7 = uVar6 | (uint)*pbVar1 << 0x10;
LAB_00164d48:
    pbVar1 = (byte *)(lVar13 + -1);
    lVar13 = lVar13 + -1;
    uVar7 = uVar7 | (uint)*pbVar1 << 8;
LAB_00164d55:
    local_50 = (*(byte *)(lVar13 + -1) | uVar7) ^ local_50;
    local_4c = uVar10 ^ local_4c;
    DES_encrypt1(&local_50,(DES_key_schedule *)schedule,1);
    uVar5 = (uint8_t)(local_50 >> 8);
    uVar8 = (uint8_t)(local_50 >> 0x10);
    *(uint *)out = local_50;
    uVar9 = (uint8_t)(local_50 >> 0x18);
    uVar2 = (uint8_t)(local_4c >> 8);
    uVar11 = (uint8_t)(local_4c >> 0x10);
    *(uint *)((long)out + 4) = local_4c;
  }
  uVar12 = (uint8_t)(local_4c >> 0x18);
  *ivec = (uint8_t)local_50;
  ivec[1] = uVar5;
  ivec[2] = uVar8;
  ivec[3] = uVar9;
  ivec[4] = (uint8_t)local_4c;
  ivec[5] = uVar2;
  ivec[6] = uVar11;
LAB_00164e4c:
  ivec[7] = uVar12;
  return;
}

Assistant:

void DES_ncbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                         const DES_key_schedule *schedule, uint8_t ivec[8],
                         int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  unsigned char *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin[0] = tin0;
      tin1 ^= tout1;
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_ENCRYPT);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin[0] = tin0;
      tin1 ^= tout1;
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_ENCRYPT);
      tout0 = tin[0];
      l2c(tout0, out);
      tout1 = tin[1];
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_DECRYPT);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = tin0;
      xor1 = tin1;
    }
    if (len != 0) {
      c2l(in, tin0);
      tin[0] = tin0;
      c2l(in, tin1);
      tin[1] = tin1;
      DES_encrypt1(tin, schedule, DES_DECRYPT);
      tout0 = tin[0] ^ xor0;
      tout1 = tin[1] ^ xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = tin0;
      xor1 = tin1;
    }
    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }
  tin[0] = tin[1] = 0;
}